

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.cpp
# Opt level: O0

void luaC_step(lua_State *L)

{
  global_State *pgVar1;
  l_mem lVar2;
  ulong local_20;
  l_mem lim;
  global_State *g;
  lua_State *L_local;
  
  pgVar1 = L->l_G;
  local_20 = (ulong)(uint)(pgVar1->gcstepmul * 10);
  if (local_20 == 0) {
    local_20 = 0x7ffffffffffffffe;
  }
  pgVar1->gcdept = (pgVar1->totalbytes - pgVar1->GCthreshold) + pgVar1->gcdept;
  do {
    lVar2 = singlestep(L);
    local_20 = local_20 - lVar2;
    if (pgVar1->gcstate == '\0') break;
  } while (0 < (long)local_20);
  if (pgVar1->gcstate == '\0') {
    pgVar1->GCthreshold = (pgVar1->estimate / 100) * (long)pgVar1->gcpause;
  }
  else if (pgVar1->gcdept < 0x400) {
    pgVar1->GCthreshold = pgVar1->totalbytes + 0x400;
  }
  else {
    pgVar1->gcdept = pgVar1->gcdept - 0x400;
    pgVar1->GCthreshold = pgVar1->totalbytes;
  }
  return;
}

Assistant:

void luaC_step (lua_State *L) {
  global_State *g = G(L);
  l_mem lim = (GCSTEPSIZE/100) * g->gcstepmul;
  if (lim == 0)
    lim = (MAX_LUMEM-1)/2;  /* no limit */
  g->gcdept += g->totalbytes - g->GCthreshold;
  do {
    lim -= singlestep(L);
    if (g->gcstate == GCSpause)
      break;
  } while (lim > 0);
  if (g->gcstate != GCSpause) {
    if (g->gcdept < GCSTEPSIZE)
      g->GCthreshold = g->totalbytes + GCSTEPSIZE;  /* - lim/g->gcstepmul;*/
    else {
      g->gcdept -= GCSTEPSIZE;
      g->GCthreshold = g->totalbytes;
    }
  }
  else {
    lua_assert(g->totalbytes >= g->estimate);
    setthreshold(g);
  }
}